

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binsertch(bstring b,int pos,int len,uchar fill)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_30;
  int i;
  int l;
  int d;
  int iStack_1c;
  uchar fill_local;
  int len_local;
  int pos_local;
  bstring b_local;
  
  if ((((pos < 0) || (b == (bstring)0x0)) || (b->slen < 0)) ||
     (((b->mlen < b->slen || (b->mlen < 1)) || (len < 0)))) {
    b_local._4_4_ = -1;
  }
  else {
    uVar1 = b->slen + len;
    uVar2 = pos + len;
    if ((int)(uVar1 | uVar2) < 0) {
      b_local._4_4_ = -1;
    }
    else {
      if ((int)uVar1 < (int)uVar2) {
        iVar3 = balloc(b,uVar2 + 1);
        if (iVar3 != 0) {
          return -1;
        }
        iStack_1c = b->slen;
        b->slen = uVar2;
      }
      else {
        iVar3 = balloc(b,uVar1 + 1);
        local_30 = uVar1;
        if (iVar3 != 0) {
          return -1;
        }
        while (local_30 = local_30 - 1, (int)uVar2 <= (int)local_30) {
          b->data[(int)local_30] = b->data[(int)(local_30 - len)];
        }
        b->slen = uVar1;
        iStack_1c = pos;
      }
      for (local_30 = iStack_1c; (int)local_30 < (int)uVar2; local_30 = local_30 + 1) {
        b->data[(int)local_30] = fill;
      }
      b->data[b->slen] = '\0';
      b_local._4_4_ = 0;
    }
  }
  return b_local._4_4_;
}

Assistant:

int binsertch (bstring b, int pos, int len, unsigned char fill) {
int d, l, i;

	if (pos < 0 || b == NULL || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || len < 0) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR;

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) return BSTR_ERR;
		pos = b->slen;
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) return BSTR_ERR;
		for (i = d - 1; i >= l; i--) {
			b->data[i] = b->data[i - len];
		}
		b->slen = d;
	}

	for (i=pos; i < l; i++) b->data[i] = fill;
	b->data[b->slen] = (unsigned char) '\0';
	return 0;
}